

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_sqlite_class.cpp
# Opt level: O3

void __thiscall test_cpp_db_sqlite::test_execute::test_method(test_execute *this)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *this_00;
  connection *pcVar1;
  test_execute *ptVar2;
  bool bVar3;
  int iVar4;
  long lVar5;
  value vVar6;
  undefined1 local_188 [16];
  undefined1 *local_178;
  char *local_170;
  value local_168;
  int local_154;
  assertion_result local_150;
  value *local_138;
  result *local_130;
  int *local_128;
  string local_120;
  value local_100;
  undefined1 local_f0 [16];
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_e0;
  test_execute *local_d0;
  result local_c8;
  result r;
  assertion_result local_b8;
  string names;
  int64_t sum;
  int local_78 [6];
  const_string local_60 [2];
  const_string local_40;
  
  boost::unit_test::anon_unknown_0::s_log_impl();
  std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::_M_replace
            (&boost::unit_test::anon_unknown_0::s_log_impl::the_inst.m_checkpoint_data.m_message,0,
             boost::unit_test::anon_unknown_0::s_log_impl::the_inst.m_checkpoint_data.m_message.
             _M_string_length,"",0);
  boost::unit_test::anon_unknown_0::s_log_impl::the_inst.m_checkpoint_data.m_file_name.m_begin =
       "/workspace/llm4binary/github/license_all_cmakelists_25/JohannAnhofer[P]cpp_db/tests/test_sqlite_class.cpp"
  ;
  boost::unit_test::anon_unknown_0::s_log_impl::the_inst.m_checkpoint_data.m_file_name.m_end = "";
  boost::unit_test::anon_unknown_0::s_log_impl::the_inst.m_checkpoint_data.m_line_num = 0x92;
  names._M_string_length = names._M_string_length & 0xffffffffffffff00;
  names._M_dataplus._M_p = "p0\x16";
  names.field_2._M_allocated_capacity = (size_type)boost::unit_test::lazy_ostream::inst;
  names.field_2._8_8_ = (long)"\t" + 1;
  pcVar1 = (this->super_BOOST_AUTO_TEST_CASE_FIXTURE).con.
           super___shared_ptr<cpp_db::connection,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
  local_f0._0_8_ = &local_e0;
  local_d0 = this;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)local_f0,"select count(*) from TEST_TABLE","");
  cpp_db::execute_scalar<>((cpp_db *)&local_100,pcVar1,(string *)local_f0);
  local_128 = (int *)cpp_db::numeric_extractor<long>(&local_100);
  local_168._M_manager = (_func_void__Op_any_ptr__Arg_ptr *)&local_128;
  local_120._M_dataplus._M_p._0_1_ = local_128 == (int *)0x3;
  local_130 = &r;
  r.result_impl._M_t.
  super___uniq_ptr_impl<cpp_db::result_interface,_std::default_delete<cpp_db::result_interface>_>.
  _M_t.
  super__Tuple_impl<0UL,_cpp_db::result_interface_*,_std::default_delete<cpp_db::result_interface>_>
  .super__Head_base<0UL,_cpp_db::result_interface_*,_false>._M_head_impl._0_4_ = 3;
  local_120._M_string_length = 0;
  local_120.field_2._M_allocated_capacity = 0;
  local_b8._0_8_ =
       "/workspace/llm4binary/github/license_all_cmakelists_25/JohannAnhofer[P]cpp_db/tests/test_sqlite_class.cpp"
  ;
  local_b8.m_message.px = (element_type *)0x16a96e;
  local_170 = (char *)&local_168;
  local_188[8] = 0;
  local_188._0_8_ = &PTR__lazy_ostream_001970f8;
  local_178 = boost::unit_test::lazy_ostream::inst;
  local_138 = (value *)&local_130;
  local_150.m_message.px = (element_type *)((ulong)local_150.m_message.px & 0xffffffffffffff00);
  local_150._0_8_ = &PTR__lazy_ostream_00196ff8;
  local_150.m_message.pn.pi_ = (sp_counted_base *)boost::unit_test::lazy_ostream::inst;
  boost::test_tools::tt_detail::report_assertion
            ((assertion_result *)&local_120,(lazy_ostream *)&names,(const_string *)&local_b8,0x92,
             CHECK,CHECK_EQUAL,2,
             "cpp_db::value_of<int64_t>(cpp_db::execute_scalar(*con, \"select count(*) from TEST_TABLE\"))"
             ,local_188,"3",&local_150);
  boost::detail::shared_count::~shared_count
            ((shared_count *)&local_120.field_2._M_allocated_capacity);
  if (local_100._M_manager != (_func_void__Op_any_ptr__Arg_ptr *)0x0) {
    (*local_100._M_manager)(_Op_destroy,&local_100,(_Arg *)0x0);
    local_100._M_manager = (_func_void__Op_any_ptr__Arg_ptr *)0x0;
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_f0._0_8_ != &local_e0) {
    operator_delete((void *)local_f0._0_8_,(ulong)(local_e0._M_allocated_capacity + 1));
  }
  pcVar1 = (local_d0->super_BOOST_AUTO_TEST_CASE_FIXTURE).con.
           super___shared_ptr<cpp_db::connection,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
  local_188._0_8_ = &local_178;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)local_188,"select * from TEST_TABLE where COL1 in (?, ?)","");
  local_150._0_4_ = 1;
  names._M_dataplus._M_p._0_4_ = 2;
  cpp_db::execute<int,int>((cpp_db *)&r,pcVar1,(string *)local_188,(int *)&local_150,(int *)&names);
  if ((undefined1 **)local_188._0_8_ != &local_178) {
    operator_delete((void *)local_188._0_8_,(ulong)((long)local_178 + 1));
  }
  sum = 0;
  names._M_dataplus._M_p = (pointer)&names.field_2;
  names._M_string_length = 0;
  names.field_2._M_allocated_capacity = names.field_2._M_allocated_capacity & 0xffffffffffffff00;
  while( true ) {
    bVar3 = cpp_db::result::is_eof(&r);
    if (bVar3) break;
    iVar4 = (int)&r;
    cpp_db::result::get_column_value((result *)local_188,iVar4);
    lVar5 = cpp_db::numeric_extractor<long>((value *)local_188);
    sum = sum + lVar5;
    if ((code *)local_188._0_8_ != (code *)0x0) {
      (*(code *)local_188._0_8_)(3,local_188,0);
    }
    vVar6 = cpp_db::result::get_column_value((result *)&local_150,iVar4);
    cpp_db::value_of<std::__cxx11::string>
              ((string *)local_188,(cpp_db *)&local_150,(value *)vVar6._M_storage._M_ptr);
    std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::_M_append
              (&names,(char *)local_188._0_8_,CONCAT71(local_188._9_7_,local_188[8]));
    if ((undefined1 **)local_188._0_8_ != &local_178) {
      operator_delete((void *)local_188._0_8_,(ulong)((long)local_178 + 1));
    }
    if ((undefined **)local_150._0_8_ != (undefined **)0x0) {
      (*(code *)local_150._0_8_)(3,(cpp_db *)&local_150,0);
    }
    cpp_db::result::move_next(&r);
  }
  boost::unit_test::anon_unknown_0::s_log_impl();
  std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::_M_replace
            (&boost::unit_test::anon_unknown_0::s_log_impl::the_inst.m_checkpoint_data.m_message,0,
             boost::unit_test::anon_unknown_0::s_log_impl::the_inst.m_checkpoint_data.m_message.
             _M_string_length,"",0);
  boost::unit_test::anon_unknown_0::s_log_impl::the_inst.m_checkpoint_data.m_file_name.m_begin =
       "/workspace/llm4binary/github/license_all_cmakelists_25/JohannAnhofer[P]cpp_db/tests/test_sqlite_class.cpp"
  ;
  boost::unit_test::anon_unknown_0::s_log_impl::the_inst.m_checkpoint_data.m_file_name.m_end = "";
  boost::unit_test::anon_unknown_0::s_log_impl::the_inst.m_checkpoint_data.m_line_num = 0x9c;
  local_f0[8] = false;
  local_f0._0_8_ = &PTR__lazy_ostream_00196fb8;
  local_e0._M_allocated_capacity = (size_type)boost::unit_test::lazy_ostream::inst;
  local_e0._8_8_ = (long)"\t" + 1;
  local_100._M_manager = (_func_void__Op_any_ptr__Arg_ptr *)&sum;
  local_130 = (result *)CONCAT44(local_130._4_4_,3);
  local_120._M_string_length = 0;
  local_120.field_2._M_allocated_capacity = 0;
  local_b8._0_8_ =
       "/workspace/llm4binary/github/license_all_cmakelists_25/JohannAnhofer[P]cpp_db/tests/test_sqlite_class.cpp"
  ;
  local_b8.m_message.px = (element_type *)0x16a96e;
  local_188[8] = 0;
  local_188._0_8_ = &PTR__lazy_ostream_001970f8;
  local_178 = boost::unit_test::lazy_ostream::inst;
  local_170 = (char *)&local_100;
  local_168._M_manager = (_func_void__Op_any_ptr__Arg_ptr *)&local_130;
  local_150.m_message.px = (element_type *)((ulong)local_150.m_message.px & 0xffffffffffffff00);
  local_150._0_8_ = &PTR__lazy_ostream_00196ff8;
  local_150.m_message.pn.pi_ = (sp_counted_base *)boost::unit_test::lazy_ostream::inst;
  local_138 = &local_168;
  local_120._M_dataplus._M_p._0_1_ = sum == 3;
  boost::test_tools::tt_detail::report_assertion
            ((assertion_result *)&local_120,(lazy_ostream *)local_f0,(const_string *)&local_b8,0x9c,
             CHECK,CHECK_EQUAL,2,"sum",local_188,"3",(cpp_db *)&local_150);
  boost::detail::shared_count::~shared_count
            ((shared_count *)&local_120.field_2._M_allocated_capacity);
  boost::unit_test::anon_unknown_0::s_log_impl();
  std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::_M_replace
            (&boost::unit_test::anon_unknown_0::s_log_impl::the_inst.m_checkpoint_data.m_message,0,
             boost::unit_test::anon_unknown_0::s_log_impl::the_inst.m_checkpoint_data.m_message.
             _M_string_length,"",0);
  boost::unit_test::anon_unknown_0::s_log_impl::the_inst.m_checkpoint_data.m_file_name.m_begin =
       "/workspace/llm4binary/github/license_all_cmakelists_25/JohannAnhofer[P]cpp_db/tests/test_sqlite_class.cpp"
  ;
  boost::unit_test::anon_unknown_0::s_log_impl::the_inst.m_checkpoint_data.m_file_name.m_end = "";
  boost::unit_test::anon_unknown_0::s_log_impl::the_inst.m_checkpoint_data.m_line_num = 0x9d;
  local_f0[8] = false;
  local_f0._0_8_ = &PTR__lazy_ostream_00196fb8;
  local_e0._M_allocated_capacity = (size_type)boost::unit_test::lazy_ostream::inst;
  local_e0._8_8_ = (long)"\t" + 1;
  iVar4 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::compare
                    (&names,"firstsecond");
  local_120._M_dataplus._M_p._0_1_ = iVar4 == 0;
  local_120._M_string_length = 0;
  local_120.field_2._M_allocated_capacity = 0;
  local_b8._0_8_ =
       "/workspace/llm4binary/github/license_all_cmakelists_25/JohannAnhofer[P]cpp_db/tests/test_sqlite_class.cpp"
  ;
  local_b8.m_message.px = (element_type *)0x16a96e;
  local_188[8] = 0;
  local_188._0_8_ = &PTR__lazy_ostream_00197038;
  local_178 = boost::unit_test::lazy_ostream::inst;
  local_170 = (char *)&local_100;
  local_168._M_manager = (_func_void__Op_any_ptr__Arg_ptr *)0x16b817;
  local_150.m_message.px = (element_type *)((ulong)local_150.m_message.px & 0xffffffffffffff00);
  local_150._0_8_ = &PTR__lazy_ostream_00197638;
  local_150.m_message.pn.pi_ = (sp_counted_base *)boost::unit_test::lazy_ostream::inst;
  local_138 = &local_168;
  local_100._M_manager = (_func_void__Op_any_ptr__Arg_ptr *)&names;
  boost::test_tools::tt_detail::report_assertion
            ((assertion_result *)&local_120,(lazy_ostream *)local_f0,(const_string *)&local_b8,0x9d,
             CHECK,CHECK_EQUAL,2,"names",local_188,"\"firstsecond\"",(cpp_db *)&local_150);
  this_00 = &local_120.field_2;
  boost::detail::shared_count::~shared_count((shared_count *)&this_00->_M_allocated_capacity);
  boost::unit_test::anon_unknown_0::s_log_impl();
  ptVar2 = local_d0;
  std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::_M_replace
            (&boost::unit_test::anon_unknown_0::s_log_impl::the_inst.m_checkpoint_data.m_message,0,
             boost::unit_test::anon_unknown_0::s_log_impl::the_inst.m_checkpoint_data.m_message.
             _M_string_length,"",0);
  boost::unit_test::anon_unknown_0::s_log_impl::the_inst.m_checkpoint_data.m_file_name.m_begin =
       "/workspace/llm4binary/github/license_all_cmakelists_25/JohannAnhofer[P]cpp_db/tests/test_sqlite_class.cpp"
  ;
  boost::unit_test::anon_unknown_0::s_log_impl::the_inst.m_checkpoint_data.m_file_name.m_end = "";
  boost::unit_test::anon_unknown_0::s_log_impl::the_inst.m_checkpoint_data.m_line_num = 0x9f;
  local_f0[8] = false;
  local_f0._0_8_ = &PTR__lazy_ostream_00196fb8;
  local_e0._M_allocated_capacity = (size_type)boost::unit_test::lazy_ostream::inst;
  local_e0._8_8_ = (long)"\t" + 1;
  pcVar1 = (ptVar2->super_BOOST_AUTO_TEST_CASE_FIXTURE).con.
           super___shared_ptr<cpp_db::connection,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
  local_120._M_dataplus._M_p = (pointer)this_00;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)&local_120,
             "select count(*) from TEST_TABLE where COL1 in (?, ?) and COL2 in (?, ?)","");
  local_154 = 1;
  local_78[1] = 2;
  cpp_db::execute_scalar<int,int,char_const(&)[6],char_const(&)[7]>
            ((cpp_db *)&local_168,pcVar1,&local_120,&local_154,local_78 + 1,(char (*) [6])"first",
             (char (*) [7])0x16b81c);
  local_c8.result_impl._M_t.
  super___uniq_ptr_impl<cpp_db::result_interface,_std::default_delete<cpp_db::result_interface>_>.
  _M_t.
  super__Tuple_impl<0UL,_cpp_db::result_interface_*,_std::default_delete<cpp_db::result_interface>_>
  .super__Head_base<0UL,_cpp_db::result_interface_*,_false>._M_head_impl =
       (unique_ptr<cpp_db::result_interface,_std::default_delete<cpp_db::result_interface>_>)
       cpp_db::numeric_extractor<long>(&local_168);
  local_130 = &local_c8;
  local_128 = local_78;
  local_78[0] = 2;
  local_b8.p_predicate_value.super_readonly_property<bool>.super_class_property<bool>.value =
       (readonly_property<bool>)
       (readonly_property<bool>)
       ((__uniq_ptr_impl<cpp_db::result_interface,_std::default_delete<cpp_db::result_interface>_>)
        local_c8.result_impl._M_t.
        super___uniq_ptr_impl<cpp_db::result_interface,_std::default_delete<cpp_db::result_interface>_>
        ._M_t.
        super__Tuple_impl<0UL,_cpp_db::result_interface_*,_std::default_delete<cpp_db::result_interface>_>
        .super__Head_base<0UL,_cpp_db::result_interface_*,_false>._M_head_impl ==
       (__uniq_ptr_impl<cpp_db::result_interface,_std::default_delete<cpp_db::result_interface>_>)
       0x2);
  local_b8.m_message.px = (element_type *)0x0;
  local_b8.m_message.pn.pi_ = (sp_counted_base *)0x0;
  local_100._M_manager = (_func_void__Op_any_ptr__Arg_ptr *)0x16a905;
  local_100._M_storage._M_ptr = "";
  local_188[8] = 0;
  local_188._0_8_ = &PTR__lazy_ostream_001970f8;
  local_178 = boost::unit_test::lazy_ostream::inst;
  local_170 = (char *)&local_130;
  local_150.m_message.px = (element_type *)((ulong)local_150.m_message.px & 0xffffffffffffff00);
  local_150._0_8_ = &PTR__lazy_ostream_00196ff8;
  local_150.m_message.pn.pi_ = (sp_counted_base *)boost::unit_test::lazy_ostream::inst;
  local_138 = (value *)&local_128;
  boost::test_tools::tt_detail::report_assertion
            (&local_b8,(lazy_ostream *)local_f0,(const_string *)&local_100,0x9f,CHECK,CHECK_EQUAL,2,
             "cpp_db::value_of<int64_t>(cpp_db::execute_scalar(*con, \"select count(*) from TEST_TABLE where COL1 in (?, ?) and COL2 in (?, ?)\", 1, 2, \"first\", \"second\"))"
             ,local_188,"2",(cpp_db *)&local_150);
  boost::detail::shared_count::~shared_count(&local_b8.m_message.pn);
  if (local_168._M_manager != (_func_void__Op_any_ptr__Arg_ptr *)0x0) {
    (*local_168._M_manager)(_Op_destroy,&local_168,(_Arg *)0x0);
    local_168._M_manager = (_func_void__Op_any_ptr__Arg_ptr *)0x0;
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_120._M_dataplus._M_p != this_00) {
    operator_delete(local_120._M_dataplus._M_p,local_120.field_2._M_allocated_capacity + 1);
  }
  pcVar1 = (ptVar2->super_BOOST_AUTO_TEST_CASE_FIXTURE).con.
           super___shared_ptr<cpp_db::connection,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
  local_188._0_8_ = &local_178;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)local_188,"delete from TEST_TABLE where COL1 = ?","");
  local_150._0_4_ = 1;
  cpp_db::execute_non_query<int>(pcVar1,(string *)local_188,(int *)&local_150);
  if ((undefined1 **)local_188._0_8_ != &local_178) {
    operator_delete((void *)local_188._0_8_,(ulong)((long)local_178 + 1));
  }
  boost::unit_test::anon_unknown_0::s_log_impl();
  std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::_M_replace
            (&boost::unit_test::anon_unknown_0::s_log_impl::the_inst.m_checkpoint_data.m_message,0,
             boost::unit_test::anon_unknown_0::s_log_impl::the_inst.m_checkpoint_data.m_message.
             _M_string_length,"",0);
  boost::unit_test::anon_unknown_0::s_log_impl::the_inst.m_checkpoint_data.m_file_name.m_begin =
       "/workspace/llm4binary/github/license_all_cmakelists_25/JohannAnhofer[P]cpp_db/tests/test_sqlite_class.cpp"
  ;
  boost::unit_test::anon_unknown_0::s_log_impl::the_inst.m_checkpoint_data.m_file_name.m_end = "";
  boost::unit_test::anon_unknown_0::s_log_impl::the_inst.m_checkpoint_data.m_line_num = 0xa0;
  local_150.p_predicate_value.super_readonly_property<bool>.super_class_property<bool>.value =
       (readonly_property<bool>)(class_property<bool>)0x1;
  local_150.m_message.px = (element_type *)0x0;
  local_150.m_message.pn.pi_ = (sp_counted_base *)0x0;
  local_188[8] = 0;
  local_188._0_8_ = &PTR__lazy_ostream_00197678;
  local_178 = boost::unit_test::lazy_ostream::inst;
  local_170 = 
  "no exceptions thrown by cpp_db::execute_non_query(*con, \"delete from TEST_TABLE where COL1 = ?\", 1)"
  ;
  local_40.m_begin =
       "/workspace/llm4binary/github/license_all_cmakelists_25/JohannAnhofer[P]cpp_db/tests/test_sqlite_class.cpp"
  ;
  local_40.m_end = "";
  boost::test_tools::tt_detail::report_assertion
            (&local_150,(lazy_ostream *)local_188,&local_40,0xa0,CHECK,CHECK_MSG,0);
  boost::detail::shared_count::~shared_count(&local_150.m_message.pn);
  boost::unit_test::anon_unknown_0::s_log_impl();
  std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::_M_replace
            (&boost::unit_test::anon_unknown_0::s_log_impl::the_inst.m_checkpoint_data.m_message,0,
             boost::unit_test::anon_unknown_0::s_log_impl::the_inst.m_checkpoint_data.m_message.
             _M_string_length,"",0);
  boost::unit_test::anon_unknown_0::s_log_impl::the_inst.m_checkpoint_data.m_file_name.m_begin =
       "/workspace/llm4binary/github/license_all_cmakelists_25/JohannAnhofer[P]cpp_db/tests/test_sqlite_class.cpp"
  ;
  boost::unit_test::anon_unknown_0::s_log_impl::the_inst.m_checkpoint_data.m_file_name.m_end = "";
  boost::unit_test::anon_unknown_0::s_log_impl::the_inst.m_checkpoint_data.m_line_num = 0xa1;
  local_f0[8] = false;
  local_f0._0_8_ = &PTR__lazy_ostream_00196fb8;
  local_e0._M_allocated_capacity = (size_type)boost::unit_test::lazy_ostream::inst;
  local_e0._8_8_ = (long)"\t" + 1;
  pcVar1 = (ptVar2->super_BOOST_AUTO_TEST_CASE_FIXTURE).con.
           super___shared_ptr<cpp_db::connection,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
  local_120._M_dataplus._M_p = (pointer)this_00;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)&local_120,"select count(*) from TEST_TABLE","");
  cpp_db::execute_scalar<>((cpp_db *)&local_168,pcVar1,&local_120);
  local_c8.result_impl._M_t.
  super___uniq_ptr_impl<cpp_db::result_interface,_std::default_delete<cpp_db::result_interface>_>.
  _M_t.
  super__Tuple_impl<0UL,_cpp_db::result_interface_*,_std::default_delete<cpp_db::result_interface>_>
  .super__Head_base<0UL,_cpp_db::result_interface_*,_false>._M_head_impl =
       (unique_ptr<cpp_db::result_interface,_std::default_delete<cpp_db::result_interface>_>)
       cpp_db::numeric_extractor<long>(&local_168);
  local_154 = 2;
  local_b8.p_predicate_value.super_readonly_property<bool>.super_class_property<bool>.value =
       (readonly_property<bool>)
       (readonly_property<bool>)
       ((__uniq_ptr_impl<cpp_db::result_interface,_std::default_delete<cpp_db::result_interface>_>)
        local_c8.result_impl._M_t.
        super___uniq_ptr_impl<cpp_db::result_interface,_std::default_delete<cpp_db::result_interface>_>
        ._M_t.
        super__Tuple_impl<0UL,_cpp_db::result_interface_*,_std::default_delete<cpp_db::result_interface>_>
        .super__Head_base<0UL,_cpp_db::result_interface_*,_false>._M_head_impl ==
       (__uniq_ptr_impl<cpp_db::result_interface,_std::default_delete<cpp_db::result_interface>_>)
       0x2);
  local_b8.m_message.px = (element_type *)0x0;
  local_b8.m_message.pn.pi_ = (sp_counted_base *)0x0;
  local_100._M_manager = (_func_void__Op_any_ptr__Arg_ptr *)0x16a905;
  local_100._M_storage._M_ptr = "";
  local_130 = &local_c8;
  local_188[8] = 0;
  local_188._0_8_ = &PTR__lazy_ostream_001970f8;
  local_178 = boost::unit_test::lazy_ostream::inst;
  local_170 = (char *)&local_130;
  local_128 = &local_154;
  local_150.m_message.px = (element_type *)((ulong)local_150.m_message.px & 0xffffffffffffff00);
  local_150._0_8_ = &PTR__lazy_ostream_00196ff8;
  local_150.m_message.pn.pi_ = (sp_counted_base *)boost::unit_test::lazy_ostream::inst;
  local_138 = (value *)&local_128;
  boost::test_tools::tt_detail::report_assertion
            (&local_b8,(lazy_ostream *)local_f0,(const_string *)&local_100,0xa1,CHECK,CHECK_EQUAL,2,
             "cpp_db::value_of<int64_t>(cpp_db::execute_scalar(*con, \"select count(*) from TEST_TABLE\"))"
             ,local_188,"2",(cpp_db *)&local_150);
  boost::detail::shared_count::~shared_count(&local_b8.m_message.pn);
  if (local_168._M_manager != (_func_void__Op_any_ptr__Arg_ptr *)0x0) {
    (*local_168._M_manager)(_Op_destroy,&local_168,(_Arg *)0x0);
    local_168._M_manager = (_func_void__Op_any_ptr__Arg_ptr *)0x0;
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_120._M_dataplus._M_p != this_00) {
    operator_delete(local_120._M_dataplus._M_p,local_120.field_2._M_allocated_capacity + 1);
  }
  pcVar1 = (ptVar2->super_BOOST_AUTO_TEST_CASE_FIXTURE).con.
           super___shared_ptr<cpp_db::connection,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
  local_188._0_8_ = &local_178;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_188,"delete from TEST_TABLE","");
  cpp_db::execute_non_query<>(pcVar1,(string *)local_188);
  if ((undefined1 **)local_188._0_8_ != &local_178) {
    operator_delete((void *)local_188._0_8_,(ulong)((long)local_178 + 1));
  }
  boost::unit_test::anon_unknown_0::s_log_impl();
  std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::_M_replace
            (&boost::unit_test::anon_unknown_0::s_log_impl::the_inst.m_checkpoint_data.m_message,0,
             boost::unit_test::anon_unknown_0::s_log_impl::the_inst.m_checkpoint_data.m_message.
             _M_string_length,"",0);
  boost::unit_test::anon_unknown_0::s_log_impl::the_inst.m_checkpoint_data.m_file_name.m_begin =
       "/workspace/llm4binary/github/license_all_cmakelists_25/JohannAnhofer[P]cpp_db/tests/test_sqlite_class.cpp"
  ;
  boost::unit_test::anon_unknown_0::s_log_impl::the_inst.m_checkpoint_data.m_file_name.m_end = "";
  boost::unit_test::anon_unknown_0::s_log_impl::the_inst.m_checkpoint_data.m_line_num = 0xa2;
  local_150.p_predicate_value.super_readonly_property<bool>.super_class_property<bool>.value =
       (readonly_property<bool>)(class_property<bool>)0x1;
  local_150.m_message.px = (element_type *)0x0;
  local_150.m_message.pn.pi_ = (sp_counted_base *)0x0;
  local_188[8] = 0;
  local_188._0_8_ = &PTR__lazy_ostream_00196e38;
  local_178 = boost::unit_test::lazy_ostream::inst;
  local_170 = "no exceptions thrown by cpp_db::execute_non_query(*con, \"delete from TEST_TABLE\")";
  local_60[0].m_begin =
       "/workspace/llm4binary/github/license_all_cmakelists_25/JohannAnhofer[P]cpp_db/tests/test_sqlite_class.cpp"
  ;
  local_60[0].m_end = "";
  boost::test_tools::tt_detail::report_assertion
            (&local_150,(lazy_ostream *)local_188,local_60,0xa2,CHECK,CHECK_MSG,0);
  boost::detail::shared_count::~shared_count(&local_150.m_message.pn);
  boost::unit_test::anon_unknown_0::s_log_impl();
  std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::_M_replace
            (&boost::unit_test::anon_unknown_0::s_log_impl::the_inst.m_checkpoint_data.m_message,0,
             boost::unit_test::anon_unknown_0::s_log_impl::the_inst.m_checkpoint_data.m_message.
             _M_string_length,"",0);
  boost::unit_test::anon_unknown_0::s_log_impl::the_inst.m_checkpoint_data.m_file_name.m_begin =
       "/workspace/llm4binary/github/license_all_cmakelists_25/JohannAnhofer[P]cpp_db/tests/test_sqlite_class.cpp"
  ;
  boost::unit_test::anon_unknown_0::s_log_impl::the_inst.m_checkpoint_data.m_file_name.m_end = "";
  boost::unit_test::anon_unknown_0::s_log_impl::the_inst.m_checkpoint_data.m_line_num = 0xa3;
  local_f0[8] = false;
  local_f0._0_8_ = &PTR__lazy_ostream_00196fb8;
  local_e0._M_allocated_capacity = (size_type)boost::unit_test::lazy_ostream::inst;
  local_e0._8_8_ = (long)"\t" + 1;
  pcVar1 = (ptVar2->super_BOOST_AUTO_TEST_CASE_FIXTURE).con.
           super___shared_ptr<cpp_db::connection,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
  local_120._M_dataplus._M_p = (pointer)this_00;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)&local_120,"select count(*) from TEST_TABLE","");
  cpp_db::execute_scalar<>((cpp_db *)&local_168,pcVar1,&local_120);
  local_c8.result_impl._M_t.
  super___uniq_ptr_impl<cpp_db::result_interface,_std::default_delete<cpp_db::result_interface>_>.
  _M_t.
  super__Tuple_impl<0UL,_cpp_db::result_interface_*,_std::default_delete<cpp_db::result_interface>_>
  .super__Head_base<0UL,_cpp_db::result_interface_*,_false>._M_head_impl =
       (unique_ptr<cpp_db::result_interface,_std::default_delete<cpp_db::result_interface>_>)
       cpp_db::numeric_extractor<long>(&local_168);
  local_154 = 0;
  local_b8.p_predicate_value.super_readonly_property<bool>.super_class_property<bool>.value =
       (readonly_property<bool>)
       (readonly_property<bool>)
       ((__uniq_ptr_impl<cpp_db::result_interface,_std::default_delete<cpp_db::result_interface>_>)
        local_c8.result_impl._M_t.
        super___uniq_ptr_impl<cpp_db::result_interface,_std::default_delete<cpp_db::result_interface>_>
        ._M_t.
        super__Tuple_impl<0UL,_cpp_db::result_interface_*,_std::default_delete<cpp_db::result_interface>_>
        .super__Head_base<0UL,_cpp_db::result_interface_*,_false>._M_head_impl ==
       (__uniq_ptr_impl<cpp_db::result_interface,_std::default_delete<cpp_db::result_interface>_>)
       0x0);
  local_b8.m_message.px = (element_type *)0x0;
  local_b8.m_message.pn.pi_ = (sp_counted_base *)0x0;
  local_100._M_manager = (_func_void__Op_any_ptr__Arg_ptr *)0x16a905;
  local_100._M_storage._M_ptr = "";
  local_130 = &local_c8;
  local_188[8] = 0;
  local_188._0_8_ = &PTR__lazy_ostream_001970f8;
  local_178 = boost::unit_test::lazy_ostream::inst;
  local_170 = (char *)&local_130;
  local_128 = &local_154;
  local_150.m_message.px = (element_type *)((ulong)local_150.m_message.px & 0xffffffffffffff00);
  local_150._0_8_ = &PTR__lazy_ostream_00196ff8;
  local_150.m_message.pn.pi_ = (sp_counted_base *)boost::unit_test::lazy_ostream::inst;
  local_138 = (value *)&local_128;
  boost::test_tools::tt_detail::report_assertion
            (&local_b8,(lazy_ostream *)local_f0,(const_string *)&local_100,0xa3,CHECK,CHECK_EQUAL,2,
             "cpp_db::value_of<int64_t>(cpp_db::execute_scalar(*con, \"select count(*) from TEST_TABLE\"))"
             ,local_188,"0",(cpp_db *)&local_150);
  boost::detail::shared_count::~shared_count(&local_b8.m_message.pn);
  if (local_168._M_manager != (_func_void__Op_any_ptr__Arg_ptr *)0x0) {
    (*local_168._M_manager)(_Op_destroy,&local_168,(_Arg *)0x0);
    local_168._M_manager = (_func_void__Op_any_ptr__Arg_ptr *)0x0;
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_120._M_dataplus._M_p != this_00) {
    operator_delete(local_120._M_dataplus._M_p,local_120.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)names._M_dataplus._M_p != &names.field_2) {
    operator_delete(names._M_dataplus._M_p,names.field_2._M_allocated_capacity + 1);
  }
  cpp_db::result::~result(&r);
  return;
}

Assistant:

BOOST_AUTO_TEST_CASE(test_execute)
{
    BOOST_CHECK_EQUAL(cpp_db::value_of<int64_t>(cpp_db::execute_scalar(*con, "select count(*) from TEST_TABLE")), 3);
    cpp_db::result r = cpp_db::execute(*con, "select * from TEST_TABLE where COL1 in (?, ?)", 1, 2);
    int64_t sum = 0;
    std::string names;
    while(!r.is_eof())
    {
        sum += cpp_db::value_of<int64_t>(r.get_column_value(0));
        names.append(cpp_db::value_of<std::string>(r.get_column_value(1)));
        r.move_next();
    }
    BOOST_CHECK_EQUAL(sum, 3);
    BOOST_CHECK_EQUAL(names, "firstsecond");

    BOOST_CHECK_EQUAL(cpp_db::value_of<int64_t>(cpp_db::execute_scalar(*con, "select count(*) from TEST_TABLE where COL1 in (?, ?) and COL2 in (?, ?)", 1, 2, "first", "second")), 2);
    BOOST_CHECK_NO_THROW(cpp_db::execute_non_query(*con, "delete from TEST_TABLE where COL1 = ?", 1));
    BOOST_CHECK_EQUAL(cpp_db::value_of<int64_t>(cpp_db::execute_scalar(*con, "select count(*) from TEST_TABLE")), 2);
    BOOST_CHECK_NO_THROW(cpp_db::execute_non_query(*con, "delete from TEST_TABLE"));
    BOOST_CHECK_EQUAL(cpp_db::value_of<int64_t>(cpp_db::execute_scalar(*con, "select count(*) from TEST_TABLE")), 0);
}